

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

int ImGui::DataTypeCompare(ImGuiDataType data_type,void *arg_1,void *arg_2)

{
  int iVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  char cVar6;
  char cVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  
  switch(data_type) {
  case 0:
    cVar6 = *arg_1;
    cVar7 = *arg_2;
    bVar16 = SBORROW1(cVar6,cVar7);
    bVar15 = (char)(cVar6 - cVar7) < '\0';
    bVar14 = cVar6 == cVar7;
    break;
  case 1:
    bVar14 = *arg_1 < *arg_2;
    bVar15 = *arg_1 == *arg_2;
    goto LAB_002ea038;
  case 2:
    sVar8 = *arg_1;
    sVar9 = *arg_2;
    bVar16 = SBORROW2(sVar8,sVar9);
    bVar15 = (short)(sVar8 - sVar9) < 0;
    bVar14 = sVar8 == sVar9;
    break;
  case 3:
    bVar14 = *arg_1 < *arg_2;
    bVar15 = *arg_1 == *arg_2;
    goto LAB_002ea038;
  case 4:
    iVar10 = *arg_1;
    iVar1 = *arg_2;
    bVar16 = SBORROW4(iVar10,iVar1);
    bVar15 = iVar10 - iVar1 < 0;
    bVar14 = iVar10 == iVar1;
    break;
  case 5:
    bVar14 = *arg_1 < *arg_2;
    bVar15 = *arg_1 == *arg_2;
    goto LAB_002ea038;
  case 6:
    lVar11 = *arg_1;
    lVar12 = *arg_2;
    bVar16 = SBORROW8(lVar11,lVar12);
    bVar15 = lVar11 - lVar12 < 0;
    bVar14 = lVar11 == lVar12;
    break;
  case 7:
    bVar14 = *arg_1 < *arg_2;
    bVar15 = *arg_1 == *arg_2;
LAB_002ea038:
    uVar13 = 0xffffffff;
    if (!bVar14) {
      uVar13 = (uint)(!bVar14 && !bVar15);
    }
    return uVar13;
  case 8:
    fVar2 = *arg_1;
    fVar3 = *arg_2;
    bVar16 = fVar3 < fVar2;
    bVar14 = fVar3 == fVar2;
    bVar15 = fVar3 < fVar2;
    goto LAB_002ea070;
  case 9:
    dVar4 = *arg_1;
    dVar5 = *arg_2;
    bVar16 = dVar5 < dVar4;
    bVar14 = dVar5 == dVar4;
    bVar15 = dVar5 < dVar4;
LAB_002ea070:
    uVar13 = 0xffffffff;
    if (bVar15 || bVar14) {
      uVar13 = (uint)bVar16;
    }
    return uVar13;
  default:
    return 0;
  }
  uVar13 = 0xffffffff;
  if (bVar16 == bVar15) {
    uVar13 = (uint)(!bVar14 && bVar16 == bVar15);
  }
  return uVar13;
}

Assistant:

int ImGui::DataTypeCompare(ImGuiDataType data_type, const void* arg_1, const void* arg_2)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:     return DataTypeCompareT<ImS8  >((const ImS8*  )arg_1, (const ImS8*  )arg_2);
    case ImGuiDataType_U8:     return DataTypeCompareT<ImU8  >((const ImU8*  )arg_1, (const ImU8*  )arg_2);
    case ImGuiDataType_S16:    return DataTypeCompareT<ImS16 >((const ImS16* )arg_1, (const ImS16* )arg_2);
    case ImGuiDataType_U16:    return DataTypeCompareT<ImU16 >((const ImU16* )arg_1, (const ImU16* )arg_2);
    case ImGuiDataType_S32:    return DataTypeCompareT<ImS32 >((const ImS32* )arg_1, (const ImS32* )arg_2);
    case ImGuiDataType_U32:    return DataTypeCompareT<ImU32 >((const ImU32* )arg_1, (const ImU32* )arg_2);
    case ImGuiDataType_S64:    return DataTypeCompareT<ImS64 >((const ImS64* )arg_1, (const ImS64* )arg_2);
    case ImGuiDataType_U64:    return DataTypeCompareT<ImU64 >((const ImU64* )arg_1, (const ImU64* )arg_2);
    case ImGuiDataType_Float:  return DataTypeCompareT<float >((const float* )arg_1, (const float* )arg_2);
    case ImGuiDataType_Double: return DataTypeCompareT<double>((const double*)arg_1, (const double*)arg_2);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return 0;
}